

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_Extensions_Test::TestBody
          (GeneratedMessageReflectionTest_Extensions_Test *this)

{
  Descriptor *base_descriptor;
  undefined1 local_c0 [8];
  ReflectionTester reflection_tester;
  TestAllExtensions message;
  GeneratedMessageReflectionTest_Extensions_Test *this_local;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&reflection_tester.import_baz_);
  base_descriptor = proto2_unittest::TestAllExtensions::descriptor();
  TestUtil::ReflectionTester::ReflectionTester((ReflectionTester *)local_c0,base_descriptor);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_c0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&reflection_tester.import_baz_);
  TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection
            ((ReflectionTester *)local_c0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ReflectionTester::ModifyRepeatedFieldsViaReflection
            ((ReflectionTester *)local_c0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ExpectRepeatedExtensionsModified<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)&reflection_tester.import_baz_);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&reflection_tester.import_baz_);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, Extensions) {
  // Set every extension to a unique value then go back and check all those
  // values.
  unittest::TestAllExtensions message;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllExtensions::descriptor());

  reflection_tester.SetAllFieldsViaReflection(&message);
  TestUtil::ExpectAllExtensionsSet(message);
  reflection_tester.ExpectAllFieldsSetViaReflection(message);

  reflection_tester.ModifyRepeatedFieldsViaReflection(&message);
  TestUtil::ExpectRepeatedExtensionsModified(message);
}